

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,Builder node,Builder sourceInfo)

{
  MemberInfo *this_local;
  
  this->parent = (MemberInfo *)0x0;
  this->codeOrder = 0;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = false;
  kj::StringPtr::StringPtr(&this->name);
  Declaration::Id::Reader::Reader(&this->declId);
  this->isParam = false;
  this->hasDefaultValue = false;
  Expression::Reader::Reader(&this->fieldType);
  Expression::Reader::Reader(&this->fieldDefaultValue);
  List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::Reader
            (&this->declAnnotations);
  this->startByte = 0;
  this->endByte = 0;
  kj::Maybe<capnp::Text::Reader>::Maybe(&this->docComment,(void *)0x0);
  kj::Maybe<capnp::schema::Field::Builder>::Maybe(&this->schema);
  memcpy(&this->node,&node,0x28);
  memcpy(&this->sourceInfo,&sourceInfo,0x28);
  (this->field_21).fieldScope = (StructOrGroup *)0x0;
  return;
}

Assistant:

inline explicit MemberInfo(schema::Node::Builder node,
                               schema::Node::SourceInfo::Builder sourceInfo)
        : parent(nullptr), codeOrder(0), isInUnion(false), node(node), sourceInfo(sourceInfo),
          unionScope(nullptr) {}